

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O3

void __thiscall
QStyle::drawItemPixmap(QStyle *this,QPainter *painter,QRect *rect,int alignment,QPixmap *pixmap)

{
  LayoutDirection direction;
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  double dVar7;
  int iVar10;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  QRect local_88;
  double local_78;
  double local_70;
  double local_68;
  double dStack_60;
  QSize local_58;
  double local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  dVar7 = (double)QPixmap::devicePixelRatio();
  direction = QGuiApplication::layoutDirection();
  uVar3 = QPixmap::size();
  iVar1 = (int)((ulong)uVar3 >> 0x20);
  auVar8._0_8_ = (double)iVar1;
  auVar8._8_8_ = (double)(int)uVar3;
  auVar12._8_8_ = dVar7;
  auVar12._0_8_ = dVar7;
  auVar9 = divpd(auVar8,auVar12);
  dVar11 = (double)((ulong)auVar9._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar9._0_8_;
  dVar13 = (double)((ulong)auVar9._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar9._8_8_;
  auVar9._4_4_ = -(uint)(-2147483648.0 < dVar13);
  auVar9._0_4_ = -(uint)(-2147483648.0 < dVar11);
  auVar9._8_4_ = -(uint)(2147483647.0 < dVar11);
  auVar9._12_4_ = -(uint)(2147483647.0 < dVar13);
  uVar2 = movmskps(iVar1,auVar9);
  uVar6 = 0x80000000;
  if ((uVar2 & 2) != 0) {
    uVar6 = (ulong)(uint)(int)dVar13;
  }
  uVar4 = 0x8000000000000000;
  if ((uVar2 & 1) != 0) {
    uVar4 = (ulong)(uint)(int)dVar11 << 0x20;
  }
  uVar5 = 0x7fffffff00000000;
  if ((uVar2 & 4) == 0) {
    uVar5 = uVar4;
  }
  uVar4 = 0x7fffffff;
  if ((uVar2 & 8) == 0) {
    uVar4 = uVar6;
  }
  local_58 = (QSize)(uVar4 | uVar5);
  local_88 = alignedRect(direction,(Alignment)alignment,&local_58,rect);
  auVar9 = QRect::operator&(&local_88,rect);
  local_48 = 0xbff0000000000000;
  uStack_40 = 0xbff0000000000000;
  iVar1 = auVar9._0_4_;
  iVar10 = auVar9._4_4_;
  local_58 = (QSize)(double)iVar1;
  dVar11 = (double)((auVar9._8_4_ - iVar1) + 1) * dVar7;
  dVar7 = (double)((auVar9._12_4_ - iVar10) + 1) * dVar7;
  local_50 = (double)iVar10;
  local_78 = (double)(iVar1 - local_88.x1.m_i);
  local_70 = (double)(iVar10 - local_88.y1.m_i);
  local_68 = (double)(int)((double)((ulong)dVar11 & 0x8000000000000000 | 0x3fe0000000000000) +
                          dVar11);
  dStack_60 = (double)(int)((double)((ulong)dVar7 & 0x8000000000000000 | 0x3fe0000000000000) + dVar7
                           );
  QPainter::drawPixmap((QRectF *)painter,(QPixmap *)&local_58,(QRectF *)pixmap);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyle::drawItemPixmap(QPainter *painter, const QRect &rect, int alignment,
                            const QPixmap &pixmap) const
{
    qreal scale = pixmap.devicePixelRatio();
    QRect aligned = alignedRect(QGuiApplication::layoutDirection(), QFlag(alignment), pixmap.size() / scale, rect);
    QRect inter = aligned.intersected(rect);

    painter->drawPixmap(inter.x(), inter.y(), pixmap, inter.x() - aligned.x(), inter.y() - aligned.y(), qRound(inter.width() * scale), qRound(inter.height() *scale));
}